

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Kss_Emu.cpp
# Opt level: O2

void __thiscall Kss_Emu::update_eq(Kss_Emu *this,blip_eq_t *eq)

{
  Blip_Synth_::treble_eq(&(this->ay).synth_.impl,eq);
  Blip_Synth_::treble_eq(&(this->scc).synth.impl,eq);
  if (this->sn != (Sms_Apu *)0x0) {
    Sms_Apu::treble_eq(this->sn,eq);
    return;
  }
  return;
}

Assistant:

void Kss_Emu::update_eq( blip_eq_t const& eq )
{
	ay.treble_eq( eq );
	scc.treble_eq( eq );
	if ( sn )
		sn->treble_eq( eq );
}